

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall libtorrent::aux::peer_connection::on_metadata_impl(peer_connection *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  int iVar5;
  iterator __beg;
  pointer psVar6;
  pointer psVar7;
  long lVar8;
  ulong uVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar11;
  
  peVar10 = (this->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->super_peer_connection_hot_members).m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
    UNLOCK();
  }
  else {
    p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
  }
  iVar5 = p_Var3->_M_use_count;
  do {
    if (iVar5 == 0) {
      peVar10 = (element_type *)0x0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_0023cc56;
    }
    LOCK();
    iVar2 = p_Var3->_M_use_count;
    bVar11 = iVar5 == iVar2;
    if (bVar11) {
      p_Var3->_M_use_count = iVar5 + 1;
      iVar2 = iVar5;
    }
    iVar5 = iVar2;
    UNLOCK();
  } while (!bVar11);
  this_00 = p_Var3;
  if (p_Var3->_M_use_count == 0) {
    peVar10 = (element_type *)0x0;
  }
LAB_0023cc56:
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1 = &p_Var3->_M_weak_count;
    iVar5 = *p_Var1;
    *p_Var1 = *p_Var1 + -1;
    UNLOCK();
  }
  else {
    iVar5 = p_Var3->_M_weak_count;
    p_Var3->_M_weak_count = iVar5 + -1;
  }
  if (iVar5 == 1) {
    (*p_Var3->_vptr__Sp_counted_base[3])();
  }
  bitfield::resize((bitfield *)&this->super_peer_connection_hot_members,
                   (((peVar10->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_num_pieces,(bool)(this->field_0x887 & 1));
  iVar5 = bitfield::count((bitfield *)&this->super_peer_connection_hot_members);
  this->m_num_pieces = iVar5;
  psVar6 = (this->m_allowed_fast).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->m_allowed_fast).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)psVar4 - (long)psVar6;
  if (0 < (long)uVar9 >> 4) {
    psVar7 = (pointer)((long)&psVar6->m_val + (uVar9 & 0xfffffffffffffff0));
    lVar8 = ((long)uVar9 >> 4) + 1;
    psVar6 = psVar6 + 2;
    do {
      if (iVar5 <= psVar6[-2].m_val) {
        psVar6 = psVar6 + -2;
        goto LAB_0023cd44;
      }
      if (iVar5 <= psVar6[-1].m_val) {
        psVar6 = psVar6 + -1;
        goto LAB_0023cd44;
      }
      if (iVar5 <= psVar6->m_val) goto LAB_0023cd44;
      if (iVar5 <= psVar6[1].m_val) {
        psVar6 = psVar6 + 1;
        goto LAB_0023cd44;
      }
      lVar8 = lVar8 + -1;
      psVar6 = psVar6 + 4;
    } while (1 < lVar8);
    uVar9 = (long)psVar4 - (long)psVar7;
    psVar6 = psVar7;
  }
  lVar8 = (long)uVar9 >> 2;
  if (lVar8 == 1) {
LAB_0023cd29:
    if (psVar6->m_val < iVar5) {
      psVar6 = psVar4;
    }
LAB_0023cd44:
    psVar7 = psVar6 + 1;
    if (psVar7 != psVar4 && psVar6 != psVar4) {
      do {
        if (psVar7->m_val < iVar5) {
          psVar6->m_val = psVar7->m_val;
          psVar6 = psVar6 + 1;
        }
        psVar7 = psVar7 + 1;
      } while (psVar7 != psVar4);
    }
    if (psVar6 != psVar4) {
      (this->m_allowed_fast).
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar6;
    }
  }
  else {
    if (lVar8 == 2) {
LAB_0023cd21:
      if (psVar6->m_val < iVar5) {
        psVar6 = psVar6 + 1;
        goto LAB_0023cd29;
      }
      goto LAB_0023cd44;
    }
    if (lVar8 == 3) {
      if (psVar6->m_val < iVar5) {
        psVar6 = psVar6 + 1;
        goto LAB_0023cd21;
      }
      goto LAB_0023cd44;
    }
  }
  psVar6 = (this->m_suggested_pieces).
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->m_suggested_pieces).
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)psVar4 - (long)psVar6;
  if (0 < (long)uVar9 >> 4) {
    psVar7 = (pointer)((long)&psVar6->m_val + (uVar9 & 0xfffffffffffffff0));
    lVar8 = ((long)uVar9 >> 4) + 1;
    psVar6 = psVar6 + 2;
    do {
      if (iVar5 <= psVar6[-2].m_val) {
        psVar6 = psVar6 + -2;
        goto LAB_0023ce19;
      }
      if (iVar5 <= psVar6[-1].m_val) {
        psVar6 = psVar6 + -1;
        goto LAB_0023ce19;
      }
      if (iVar5 <= psVar6->m_val) goto LAB_0023ce19;
      if (iVar5 <= psVar6[1].m_val) {
        psVar6 = psVar6 + 1;
        goto LAB_0023ce19;
      }
      lVar8 = lVar8 + -1;
      psVar6 = psVar6 + 4;
    } while (1 < lVar8);
    uVar9 = (long)psVar4 - (long)psVar7;
    psVar6 = psVar7;
  }
  lVar8 = (long)uVar9 >> 2;
  if (lVar8 == 1) {
LAB_0023cdfe:
    if (psVar6->m_val < iVar5) {
      psVar6 = psVar4;
    }
  }
  else if (lVar8 == 2) {
LAB_0023cdf6:
    if (psVar6->m_val < iVar5) {
      psVar6 = psVar6 + 1;
      goto LAB_0023cdfe;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_0023ce51;
    if (psVar6->m_val < iVar5) {
      psVar6 = psVar6 + 1;
      goto LAB_0023cdf6;
    }
  }
LAB_0023ce19:
  psVar7 = psVar6 + 1;
  if (psVar7 != psVar4 && psVar6 != psVar4) {
    do {
      if (psVar7->m_val < iVar5) {
        psVar6->m_val = psVar7->m_val;
        psVar6 = psVar6 + 1;
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar4);
  }
  if (psVar6 != psVar4) {
    (this->m_suggested_pieces).
    super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    .
    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar6;
  }
LAB_0023ce51:
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[8])(this);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void peer_connection::on_metadata_impl()
	{
		TORRENT_ASSERT(is_single_thread());
		auto t = associated_torrent().lock();
		m_have_piece.resize(t->torrent_file().num_pieces(), m_have_all);
		m_num_pieces = m_have_piece.count();

		piece_index_t const limit(m_num_pieces);

		// now that we know how many pieces there are
		// remove any invalid allowed_fast and suggest pieces
		// now that we know what the number of pieces are
		m_allowed_fast.erase(std::remove_if(m_allowed_fast.begin(), m_allowed_fast.end()
			, [=](piece_index_t const p) { return p >= limit; })
			, m_allowed_fast.end());

		// remove any piece suggested to us whose index is invalid
		// now that we know how many pieces there are
		m_suggested_pieces.erase(
			std::remove_if(m_suggested_pieces.begin(), m_suggested_pieces.end()
				, [=](piece_index_t const p) { return p >= limit; })
			, m_suggested_pieces.end());

		on_metadata();
		if (m_disconnecting) return;
	}